

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O1

_Bool al_get_opengl_texture_size(ALLEGRO_BITMAP *bitmap,int *w,int *h)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ALLEGRO_BITMAP *bitmap_00;
  
  bitmap_00 = bitmap->parent;
  if (bitmap->parent == (ALLEGRO_BITMAP *)0x0) {
    bitmap_00 = bitmap;
  }
  uVar2 = al_get_bitmap_flags(bitmap_00);
  if ((uVar2 & 0x20) == 0) {
    *w = 0;
    iVar3 = 0;
  }
  else {
    piVar1 = (int *)bitmap_00->extra;
    *w = *piVar1;
    iVar3 = piVar1[1];
  }
  *h = iVar3;
  return SUB41((uVar2 & 0x20) >> 5,0);
}

Assistant:

bool al_get_opengl_texture_size(ALLEGRO_BITMAP *bitmap, int *w, int *h)
{
   /* The designers of OpenGL ES 1.0 forgot to add a function to query
    * texture sizes, so this will be the only way there to get the texture
    * size. On normal OpenGL also glGetTexLevelParameter could be used.
    */
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_bitmap;
   if (bitmap->parent)
      bitmap = bitmap->parent;
   
   if (!(al_get_bitmap_flags(bitmap) & _ALLEGRO_INTERNAL_OPENGL)) {
      *w = 0;
      *h = 0;
      return false;
   }

   ogl_bitmap = bitmap->extra;
   *w = ogl_bitmap->true_w;
   *h = ogl_bitmap->true_h;
   return true;
}